

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

wal_item * wal_itr_next(wal_iterator *wal_itr)

{
  snap_handle *psVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  wal_item *pwVar7;
  avl_node *paVar8;
  code *func;
  avl_node *paVar9;
  list_elem *plVar10;
  avl_node *paVar11;
  long lVar12;
  bool bVar13;
  fdb_kvs_id_t kv_id;
  fdb_kvs_id_t local_70;
  avl_node local_68;
  avl_node *paStack_50;
  avl_node *local_48;
  avl_node *paStack_40;
  
  if (wal_itr->shandle->is_persisted_snapshot == true) {
    paVar5 = avl_next(wal_itr->cursor_pos);
    wal_itr->cursor_pos = paVar5;
    if (wal_itr->by_key == true) {
      pwVar7 = (wal_item *)&paVar5[-5].right;
    }
    else {
      pwVar7 = (wal_item *)&paVar5[-1].left;
    }
    if (paVar5 != (avl_node *)0x0) {
      return pwVar7;
    }
    return (wal_item *)0x0;
  }
  if (wal_itr->shandle->snap_tag_idx == 0) {
LAB_0015193d:
    pwVar7 = (wal_item *)0x0;
  }
  else {
    if (wal_itr->direction == '\x01') {
      paVar5 = wal_itr->cursor_pos;
      if (paVar5 == (avl_node *)0x0) goto LAB_0015193d;
      if (wal_itr->by_key == true) {
        local_68.parent = paVar5->parent;
        local_68.left = paVar5->left;
        local_68.right = paVar5->right;
        paStack_50 = paVar5[1].parent;
        local_48 = paVar5[1].left;
        paStack_40 = paVar5[1].right;
        paVar6 = paStack_50[1].right;
        lVar12 = (long)paVar5 - (long)wal_itr->cursors;
        wal_itr->item_prev = (wal_item *)paVar5[1].parent;
        pthread_spin_lock((pthread_spinlock_t *)((long)&wal_itr->map_shards->lock + (lVar12 >> 1)));
        avl_set_aux((avl_tree *)((long)&(wal_itr->map_shards->_map).root + (lVar12 >> 1)),
                    &wal_itr->shandle->cmp_info);
        paVar6 = avl_next(paVar6);
        while ((paVar6 != (avl_node *)0x0 &&
               ((wal_itr->multi_kvs != true ||
                (buf2kvid((ulong)*(byte *)((long)&paVar6[1].left + 2),paVar6[1].parent,&local_70),
                local_70 == wal_itr->shandle->id))))) {
          paVar8 = paVar6[1].right;
          if (paVar8 == (avl_node *)0x0) {
            paVar11 = (avl_node *)0x0;
          }
          else {
            psVar1 = wal_itr->shandle;
            paVar2 = (avl_node *)psVar1->snap_tag_idx;
            paVar9 = (avl_node *)0x0;
            do {
              paVar4 = paVar9;
              if (((paVar8[2].left == (avl_node *)psVar1->snap_txn->txn_id) ||
                  (((ulong)paVar8[3].parent & 0x100) != 0)) && (paVar8[2].right[1].left <= paVar2))
              {
                if ((((ulong)paVar8[3].parent & 0x100) != 0) &&
                   ((fdb_txn *)paVar8[2].parent != psVar1->snap_txn &&
                    (fdb_txn *)paVar8[2].parent != psVar1->global_txn)) {
                  plVar10 = (psVar1->active_txn_list).head;
                  bVar13 = plVar10 != (list_elem *)0x0;
                  if (bVar13) {
                    do {
                      if ((avl_node *)plVar10[1].prev == paVar8[2].left) goto LAB_00151884;
                      plVar10 = plVar10->next;
                      bVar13 = plVar10 != (list_elem *)0x0;
                    } while (bVar13);
                  }
                  if (bVar13) goto LAB_00151884;
                }
                paVar3 = paVar8[2].right[1].left;
                paVar11 = paVar8;
                if (paVar3 == paVar2) break;
                if (((paVar3 < paVar2 && (avl_node *)psVar1->snap_stop_idx < paVar3) &&
                    (paVar4 = paVar8, paVar9 != (avl_node *)0x0)) &&
                   (paVar4 = paVar9, paVar9[2].right[1].left < paVar3)) {
                  paVar4 = paVar8;
                }
              }
LAB_00151884:
              paVar9 = paVar4;
              paVar8 = paVar8->left;
              paVar11 = paVar9;
            } while (paVar8 != (avl_node *)0x0);
          }
          if (paVar11 != (avl_node *)0x0) goto LAB_001518ba;
          paVar6 = avl_next(paVar6);
        }
        paVar11 = (avl_node *)0x0;
LAB_001518ba:
        pthread_spin_unlock(&wal_itr->map_shards->lock + (lVar12 >> 4) * 2);
        avl_remove(&wal_itr->merge_tree,paVar5);
        paVar5 = (avl_node *)(lVar12 + (long)wal_itr->cursors);
        if (paVar11 == (avl_node *)0x0) {
          paVar5[1].parent = (avl_node *)0x0;
        }
        else {
          paVar5[1].parent = paVar11;
          avl_insert(&wal_itr->merge_tree,paVar5,_merge_cmp_bykey);
        }
        func = _merge_cmp_bykey;
      }
      else {
        local_68.parent = paVar5->parent;
        local_68.left = paVar5->left;
        local_68.right = paVar5->right;
        paStack_50 = paVar5[1].parent;
        local_48 = paVar5[1].left;
        paStack_40 = paVar5[1].right;
        lVar12 = (long)paVar5 - (long)wal_itr->cursors;
        wal_itr->item_prev = (wal_item *)paVar5[1].parent;
        pthread_spin_lock((pthread_spinlock_t *)((long)&wal_itr->map_shards->lock + (lVar12 >> 1)));
        paVar6 = avl_next((avl_node *)&paStack_50->right);
        while ((paVar6 != (avl_node *)0x0 &&
               ((wal_itr->multi_kvs != true ||
                (buf2kvid((ulong)*(byte *)((long)&paVar6[1].parent[1].left + 2),
                          paVar6[1].parent[1].parent,&local_70), local_70 == wal_itr->shandle->id)))
               )) {
          paVar8 = paVar6[1].parent[1].right;
          if (paVar8 == (avl_node *)0x0) {
            paVar11 = (avl_node *)0x0;
          }
          else {
            psVar1 = wal_itr->shandle;
            paVar2 = (avl_node *)psVar1->snap_tag_idx;
            paVar9 = (avl_node *)0x0;
            do {
              paVar4 = paVar9;
              if (((paVar8[2].left == (avl_node *)psVar1->snap_txn->txn_id) ||
                  (((ulong)paVar8[3].parent & 0x100) != 0)) && (paVar8[2].right[1].left <= paVar2))
              {
                if ((((ulong)paVar8[3].parent & 0x100) != 0) &&
                   ((fdb_txn *)paVar8[2].parent != psVar1->snap_txn &&
                    (fdb_txn *)paVar8[2].parent != psVar1->global_txn)) {
                  plVar10 = (psVar1->active_txn_list).head;
                  bVar13 = plVar10 != (list_elem *)0x0;
                  if (bVar13) {
                    do {
                      if ((avl_node *)plVar10[1].prev == paVar8[2].left) goto LAB_00151aba;
                      plVar10 = plVar10->next;
                      bVar13 = plVar10 != (list_elem *)0x0;
                    } while (bVar13);
                  }
                  if (bVar13) goto LAB_00151aba;
                }
                paVar3 = paVar8[2].right[1].left;
                paVar11 = paVar8;
                if (paVar3 == paVar2) break;
                if (((paVar3 < paVar2 && (avl_node *)psVar1->snap_stop_idx < paVar3) &&
                    (paVar4 = paVar8, paVar9 != (avl_node *)0x0)) &&
                   (paVar4 = paVar9, paVar9[2].right[1].left < paVar3)) {
                  paVar4 = paVar8;
                }
              }
LAB_00151aba:
              paVar9 = paVar4;
              paVar8 = paVar8->left;
              paVar11 = paVar9;
            } while (paVar8 != (avl_node *)0x0);
          }
          paVar8 = (avl_node *)&paVar6[-1].left;
          if (paVar8 == paVar11) goto LAB_00151af5;
          paVar6 = avl_next(paVar6);
        }
        paVar8 = (avl_node *)0x0;
LAB_00151af5:
        pthread_spin_unlock(&wal_itr->map_shards->lock + (lVar12 >> 4) * 2);
        avl_remove(&wal_itr->merge_tree,paVar5);
        paVar5 = (avl_node *)(lVar12 + (long)wal_itr->cursors);
        if (paVar8 == (avl_node *)0x0) {
          paVar5[1].parent = (avl_node *)0x0;
        }
        else {
          paVar5[1].parent = paVar8;
          avl_insert(&wal_itr->merge_tree,paVar5,_merge_cmp_byseq);
        }
        func = _merge_cmp_byseq;
      }
      paVar5 = avl_search_greater(&wal_itr->merge_tree,&local_68,func);
      wal_itr->cursor_pos = paVar5;
      if (paVar5 == (avl_node *)0x0) {
        pwVar7 = (wal_item *)0x0;
      }
      else {
        pwVar7 = (wal_item *)paVar5[1].parent;
      }
    }
    else {
      pwVar7 = wal_itr->item_prev;
      if (pwVar7 == (wal_item *)0x0) goto LAB_0015193d;
      if (wal_itr->by_key == true) {
        pwVar7 = _wal_itr_search_greater_bykey(wal_itr,pwVar7);
      }
      else {
        pwVar7 = _wal_itr_search_greater_byseq(wal_itr,pwVar7);
      }
    }
    wal_itr->direction = '\x01';
  }
  return pwVar7;
}

Assistant:

struct wal_item* wal_itr_next(struct wal_iterator *wal_itr)
{
    struct wal_item *result = NULL;
    if (wal_itr->shandle->is_persisted_snapshot) {
        wal_itr->cursor_pos = avl_next(wal_itr->cursor_pos);
        if (wal_itr->by_key) {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_keysnap) : NULL;
        } else {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_seq) : NULL;
        }
    }

    if (!wal_itr->shandle->snap_tag_idx) { // no items in WAL in snapshot..
        return NULL;
    }
    if (wal_itr->direction == FDB_ITR_FORWARD) {
        if (!wal_itr->cursor_pos) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_next_bykey(wal_itr);
        } else {
            result = _wal_itr_next_byseq(wal_itr);
        }
    } else { // change of direction involves searching across all shards..
        if (!wal_itr->item_prev) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_search_greater_bykey(wal_itr,
                                                   wal_itr->item_prev);
        } else {
            result = _wal_itr_search_greater_byseq(wal_itr,
                                                   wal_itr->item_prev);
        }
    }
    wal_itr->direction = FDB_ITR_FORWARD;
    return result;
}